

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::piece_picker::get_availability(piece_picker *this,vector<int,_piece_index_t> *avail)

{
  pointer ppVar1;
  pointer ppVar2;
  int *piVar3;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)avail,
             (long)(this->m_piece_map).
                   super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   .
                   super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_piece_map).
                   super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   .
                   super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppVar2 = (this->m_piece_map).
           super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_piece_map).
           super_vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           .
           super__Vector_base<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    piVar3 = *(int **)avail;
    do {
      *piVar3 = (*(uint *)ppVar2 & 0x3ffffff) + this->m_seeds;
      ppVar2 = ppVar2 + 1;
      piVar3 = piVar3 + 1;
    } while (ppVar2 != ppVar1);
  }
  return;
}

Assistant:

void piece_picker::get_availability(aux::vector<int, piece_index_t>& avail) const
	{
		TORRENT_ASSERT(m_seeds >= 0);
		INVARIANT_CHECK;

		avail.resize(m_piece_map.size());
		auto j = avail.begin();
		for (auto i = m_piece_map.begin(), end(m_piece_map.end()); i != end; ++i, ++j)
			*j = i->peer_count + m_seeds;
	}